

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# z80.cpp
# Opt level: O0

void Z80::OpCode_Next_SETBRK(void)

{
  byte bVar1;
  bool bVar2;
  word wVar3;
  word wVar4;
  int iStack_18;
  word endad;
  word startad;
  int e [4];
  
  if (DAT_001e16a8._4_4_ < 2) {
    Error("[SETBRK] fake instruction \"setbrk\" must be specifically enabled by --zxnext=cspect option"
          ,(char *)0x0,PASS3);
    SkipToEol(&::lp);
  }
  else {
    _iStack_18 = 0x1000000ed;
    e[0] = -1;
    e[1] = -1;
    bVar1 = GetByte(&::lp,false);
    e[0] = (uint)bVar1;
    bVar2 = comma(&::lp);
    if (bVar2) {
      wVar3 = GetWord(&::lp);
      bVar2 = comma(&::lp);
      if (bVar2) {
        wVar4 = GetWord(&::lp);
        EmitBytes(&iStack_18,true);
        EmitWord((uint)wVar3,false);
        EmitWord((uint)wVar4,false);
        return;
      }
    }
    Error("[SETBRK] syntax: SETBRK <type>, <start_address>, <end_address>",(char *)0x0,PASS3);
  }
  return;
}

Assistant:

static void OpCode_Next_SETBRK() {	// this is fake instruction for CSpect emulator, not for real Z80N
		if (Options::syx.IsNextEnabled < 2) {
			Error("[SETBRK] fake instruction \"setbrk\" must be specifically enabled by --zxnext=cspect option");
			SkipToEol(lp);
			return;
		}
		int e[] { 0xED, 0x01, -1, -1 };
		e[2] = GetByte(lp);						// type
		if (comma(lp)) {
			word startad = GetWord(lp);			// start address
			if (comma(lp)) {
				word endad = GetWord(lp);		// end address
				EmitBytes(e, true);
				EmitWord(startad);
				EmitWord(endad);
				return;
			}
		}
		Error("[SETBRK] syntax: SETBRK <type>, <start_address>, <end_address>");
	}